

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O2

callbacks pstore::exchange::import_ns::callbacks::
          make<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,pstore::repo::external_fixup>,pstore::exchange::import_ns::string_mapping_const*,pstore::gsl::not_null<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>*>>
                    (not_null<pstore::database_*> db,string_mapping *args,
                    not_null<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>
                    args_1)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  callbacks cVar1;
  shared_ptr<pstore::exchange::import_ns::context> ctxt;
  _Head_base<0UL,_pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>_*,_false>
  local_60;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_58;
  shared_ptr<pstore::exchange::import_ns::context> local_50;
  database *local_40;
  not_null<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>
  local_38 [3];
  
  std::
  make_shared<pstore::exchange::import_ns::context,pstore::gsl::not_null<pstore::database*>const&>
            ((not_null<pstore::database_*> *)&local_50);
  local_40 = (database *)
             local_50.
             super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  std::
  make_unique<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,pstore::repo::external_fixup>,pstore::exchange::import_ns::context*,pstore::exchange::import_ns::string_mapping_const*&,pstore::gsl::not_null<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>*>&>
            ((context **)&local_60,(string_mapping **)&local_40,local_38);
  local_58._M_head_impl = &(local_60._M_head_impl)->super_rule;
  local_60._M_head_impl =
       (fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup> *)
       0x0;
  callbacks((callbacks *)in_RDI,&local_50,
            (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
             *)&local_58);
  if ((fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup> *)
      local_58._M_head_impl !=
      (fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup> *)
      0x0) {
    (*((rule *)&(local_58._M_head_impl)->_vptr_rule)->_vptr_rule[1])();
  }
  local_58._M_head_impl = (rule *)0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_std::default_delete<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>_>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>,_std::default_delete<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,_pstore::repo::external_fixup>_>_>
                 *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.
              super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  cVar1.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  cVar1.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (callbacks)
         cVar1.context_.
         super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static callbacks make (gsl::not_null<database *> const db, Args... args) {
                    auto ctxt = std::make_shared<context> (db);
                    return {ctxt, std::make_unique<Rule> (ctxt.get (), args...)};
                }